

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreateDefaultBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,bool null_const_for_phi_is_needed,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *phi_operands,uint32_t merge_block_id)

{
  uint32_t type_id;
  BasicBlock *parent_block;
  DefUseManager *this_00;
  Instruction *pIVar1;
  undefined7 in_register_00000031;
  uint32_t local_2c;
  
  parent_block = CreateNewBlock(this);
  AddBranchToBlock(this,parent_block,merge_block_id);
  if ((int)CONCAT71(in_register_00000031,null_const_for_phi_is_needed) != 0) {
    this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    pIVar1 = analysis::DefUseManager::GetDef
                       (this_00,*(phi_operands->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
    type_id = Instruction::type_id(pIVar1);
    pIVar1 = GetConstNull(this,type_id);
    local_2c = Instruction::result_id(pIVar1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (phi_operands,&local_2c);
  }
  return parent_block;
}

Assistant:

BasicBlock* ReplaceDescArrayAccessUsingVarIndex::CreateDefaultBlock(
    bool null_const_for_phi_is_needed, std::vector<uint32_t>* phi_operands,
    uint32_t merge_block_id) const {
  auto* default_block = CreateNewBlock();
  AddBranchToBlock(default_block, merge_block_id);
  if (!null_const_for_phi_is_needed) return default_block;

  // Create null value for OpPhi
  Instruction* inst = context()->get_def_use_mgr()->GetDef((*phi_operands)[0]);
  auto* null_const_inst = GetConstNull(inst->type_id());
  phi_operands->push_back(null_const_inst->result_id());
  return default_block;
}